

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManMergeDist1Pairs
              (Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev,Vec_Int_t *vStats,int nLimit)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vPairs_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  word *pwVar6;
  word *pwVar7;
  word *pwVar8;
  Vec_Int_t *vToFree;
  word *pCube2;
  word *pCube1;
  word *pCube;
  int iVar;
  int iCubeNew;
  int c2;
  int c1;
  int i;
  int w;
  int nCubes;
  Vec_Int_t *vPairsNew;
  Vec_Int_t *vPairs;
  int nLimit_local;
  Vec_Int_t *vStats_local;
  Vec_Int_t *vGroupPrev_local;
  Vec_Int_t *vGroup_local;
  Mop_Man_t *p_local;
  
  vPairs_00 = Mop_ManFindDist1Pairs(p,vGroup);
  iVar1 = Vec_IntSize(vGroup);
  p_01 = Mop_ManCompatiblePairs(vPairs_00,iVar1);
  iVar1 = Vec_IntSize(vGroup);
  iVar2 = Vec_IntSize(vGroupPrev);
  iVar3 = Vec_IntSize(p_01);
  p_02 = Vec_IntAlloc(iVar3);
  c2 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p_01);
    if (iVar3 <= c2 + 1) {
      for (c2 = 0; iVar3 = Vec_IntSize(p_02), c2 < iVar3; c2 = c2 + 1) {
        iVar3 = Vec_IntEntry(p_02,c2);
        iVar5 = Vec_IntEntry(vGroup,iVar3);
        if (iVar5 != -1) {
          p_00 = p->vFree;
          iVar5 = Vec_IntEntry(vGroup,iVar3);
          Vec_IntPush(p_00,iVar5);
          Vec_IntWriteEntry(vGroup,iVar3,-1);
        }
      }
      Vec_IntFree(p_02);
      iVar3 = Vec_IntSize(p_01);
      if (0 < iVar3) {
        Map_ManGroupCompact(vGroup);
      }
      Vec_IntFree(vPairs_00);
      Vec_IntFree(p_01);
      iVar3 = Vec_IntSize(vGroup);
      iVar5 = Vec_IntSize(vGroupPrev);
      return ((iVar1 + iVar2) - iVar3) - iVar5;
    }
    iVar3 = Vec_IntEntry(p_01,c2);
    iVar5 = Vec_IntEntry(p_01,c2 + 1);
    iVar4 = Vec_IntEntry(vGroup,iVar3);
    pwVar6 = Mop_ManCubeIn(p,iVar4);
    iVar4 = Vec_IntEntry(vGroup,iVar5);
    pwVar7 = Mop_ManCubeIn(p,iVar4);
    iVar4 = Mop_ManCheckDist1(pwVar6,pwVar7,p->nWordsIn);
    if (iVar4 == 0) break;
    iVar4 = Mop_ManFindDiffVar(pwVar6,pwVar7,p->nWordsIn);
    iVar4 = Vec_IntEntry(vStats,iVar4);
    if (iVar4 <= nLimit) {
      Vec_IntPush(p_02,iVar3);
      Vec_IntPush(p_02,iVar5);
      iVar4 = Vec_IntPop(p->vFree);
      pwVar8 = Mop_ManCubeIn(p,iVar4);
      for (c1 = 0; c1 < p->nWordsIn; c1 = c1 + 1) {
        pwVar8[c1] = pwVar6[c1] & pwVar7[c1];
      }
      pwVar6 = Mop_ManCubeOut(p,iVar4);
      iVar3 = Vec_IntEntry(vGroup,iVar3);
      pwVar7 = Mop_ManCubeOut(p,iVar3);
      iVar3 = Vec_IntEntry(vGroup,iVar5);
      pwVar8 = Mop_ManCubeOut(p,iVar3);
      iVar3 = memcmp(pwVar7,pwVar8,(long)p->nWordsOut << 3);
      if (iVar3 != 0) {
        __assert_fail("!memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                      ,0x201,
                      "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      for (c1 = 0; c1 < p->nWordsOut; c1 = c1 + 1) {
        pwVar6[c1] = pwVar7[c1];
      }
      Vec_IntPush(vGroupPrev,iVar4);
    }
    c2 = c2 + 2;
  }
  __assert_fail("Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                ,0x1ef,
                "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
               );
}

Assistant:

int Mop_ManMergeDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vPairs    = Mop_ManFindDist1Pairs( p, vGroup );
    Vec_Int_t * vPairsNew = Mop_ManCompatiblePairs( vPairs, Vec_IntSize(vGroup) );
    int nCubes = Vec_IntSize(vGroup) + Vec_IntSize(vGroupPrev);
    int w, i, c1, c2, iCubeNew, iVar;
    // move cubes to the previous group
    word * pCube, * pCube1, * pCube2;
    Vec_Int_t * vToFree = Vec_IntAlloc( Vec_IntSize(vPairsNew) );
    Vec_IntForEachEntryDouble( vPairsNew, c1, c2, i )
    {
        pCube1 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c2) );
        assert( Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) );

        // skip those cubes that have frequently appearing variables
        iVar = Mop_ManFindDiffVar( pCube1, pCube2, p->nWordsIn );
        if ( Vec_IntEntry( vStats, iVar ) > nLimit )
            continue;
        Vec_IntPush( vToFree, c1 );
        Vec_IntPush( vToFree, c2 );

        iCubeNew  = Vec_IntPop( p->vFree );
        pCube  = Mop_ManCubeIn( p, iCubeNew );
        for ( w = 0; w < p->nWordsIn; w++ )
            pCube[w] = pCube1[w] & pCube2[w];

        pCube  = Mop_ManCubeOut( p, iCubeNew );
        pCube1 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c2) );

        assert( !memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut) );
        for ( w = 0; w < p->nWordsOut; w++ )
            pCube[w] = pCube1[w];

        Vec_IntPush( vGroupPrev, iCubeNew );
    }
//    Vec_IntForEachEntry( vPairsNew, c1, i )
    Vec_IntForEachEntry( vToFree, c1, i )
    {
        if ( Vec_IntEntry(vGroup, c1) == -1 )
            continue;
        Vec_IntPush( p->vFree, Vec_IntEntry(vGroup, c1) );
        Vec_IntWriteEntry( vGroup, c1, -1 );
    }
    Vec_IntFree( vToFree );
    if ( Vec_IntSize(vPairsNew) > 0 )
        Map_ManGroupCompact( vGroup );
    Vec_IntFree( vPairs );
    Vec_IntFree( vPairsNew );
    return nCubes - Vec_IntSize(vGroup) - Vec_IntSize(vGroupPrev);
}